

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

int fy_emit_setup(fy_emitter *emit,fy_emitter_cfg *cfg)

{
  int iVar1;
  fy_diag_cfg *cfg_00;
  fy_diag *diag;
  fy_diag_cfg dcfg;
  
  memset(emit,0,0x558);
  emit->cfg = cfg;
  diag = cfg->diag;
  if (diag == (fy_diag *)0x0) {
    cfg_00 = fy_diag_cfg_from_parser(&dcfg,(fy_parser *)0x0);
    diag = fy_diag_create(cfg_00);
    if (diag == (fy_diag *)0x0) {
      return -1;
    }
  }
  else {
    fy_diag_ref(diag);
  }
  emit->diag = diag;
  memset(&(emit->ea).next,0,0x120);
  (emit->ea).emit = emit;
  (emit->ea).accum = (emit->ea).inplace;
  (emit->ea).alloc = 0x100;
  iVar1 = emit->column;
  (emit->ea).start_col = iVar1;
  (emit->ea).ts = 8;
  (emit->ea).col = iVar1;
  (emit->queued_events)._lh.next = &(emit->queued_events)._lh;
  (emit->queued_events)._lh.prev = &(emit->queued_events)._lh;
  emit->state_stack = emit->state_stack_inplace;
  emit->state_stack_alloc = 0x40;
  emit->sc_stack = emit->sc_stack_inplace;
  emit->sc_stack_alloc = 0x10;
  fy_emit_reset(emit,false);
  return 0;
}

Assistant:

int fy_emit_setup(struct fy_emitter *emit, const struct fy_emitter_cfg *cfg) {
    struct fy_diag_cfg dcfg;
    struct fy_diag *diag;

    memset(emit, 0, sizeof(*emit));

    emit->cfg = cfg;

    diag = cfg->diag;

    if (!diag) {
        diag = fy_diag_create(fy_diag_cfg_from_parser(&dcfg, NULL));
        if (!diag)
            return -1;
    } else
        fy_diag_ref(diag);

    emit->diag = diag;

    fy_emit_accum_init(&emit->ea, emit);
    fy_eventp_list_init(&emit->queued_events);

    emit->state_stack = emit->state_stack_inplace;
    emit->state_stack_alloc = sizeof(emit->state_stack_inplace) / sizeof(emit->state_stack_inplace[0]);

    emit->sc_stack = emit->sc_stack_inplace;
    emit->sc_stack_alloc = sizeof(emit->sc_stack_inplace) / sizeof(emit->sc_stack_inplace[0]);

    fy_emit_reset(emit, false);

    return 0;
}